

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

size_t io::net::
       read<io::basic_string_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>,io::net::transfer_exactly,void>
                 (basic_string_stream<char,_std::char_traits<char>_> *stream,
                 dynamic_vector_buffer<char,_std::allocator<char>_> *b,
                 transfer_exactly completion_condition)

{
  bool bVar1;
  size_t sVar2;
  system_error *this;
  error_code __ec;
  size_t bytes_read;
  error_code ec;
  dynamic_vector_buffer<char,_std::allocator<char>_> *b_local;
  basic_string_stream<char,_std::char_traits<char>_> *stream_local;
  transfer_exactly completion_condition_local;
  
  ec._M_cat = (error_category *)b;
  std::error_code::error_code((error_code *)&bytes_read);
  sVar2 = read<io::basic_string_stream<char,std::char_traits<char>>,io::net::dynamic_vector_buffer<char,std::allocator<char>>,io::net::transfer_exactly,void>
                    (stream,(dynamic_vector_buffer<char,_std::allocator<char>_> *)ec._M_cat,
                     completion_condition,(error_code *)&bytes_read);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&bytes_read);
  if (!bVar1) {
    return sVar2;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._0_8_ = bytes_read & 0xffffffff;
  __ec._M_cat = (error_category *)ec._0_8_;
  std::system_error::system_error(this,__ec,"read");
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t read(SyncReadStream& stream, DynamicBuffer&& b,
                 CompletionCondition completion_condition)
{
    std::error_code ec;
    std::size_t bytes_read = read(stream, std::forward<DynamicBuffer>(b),
                                  completion_condition, ec);
    if (ec) throw std::system_error(ec, __func__);
    return bytes_read;
}